

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

bool anon_unknown.dwarf_7f1d8::testRequired(void)

{
  bool bVar1;
  ostream *poVar2;
  Value local_f0;
  undefined4 local_c4;
  undefined1 local_c0 [8];
  cmJSONState state;
  int i;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string str;
  Value v;
  
  Json::Value::Value((Value *)((long)&str.field_2 + 8),"Hello");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"default",&local_59);
  std::allocator<char>::~allocator(&local_59);
  state.doc.field_2._8_4_ = 1;
  cmJSONState::cmJSONState((cmJSONState *)local_c0);
  bVar1 = std::
          function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                        *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(Value *)((long)&str.field_2 + 8),(cmJSONState *)local_c0);
  if (bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"Hello");
    if (bVar1) {
      bVar1 = std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                        ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                         (anonymous_namespace)::RequiredIntHelper,
                         (int *)(state.doc.field_2._M_local_buf + 8),
                         (Value *)((long)&str.field_2 + 8),(cmJSONState *)local_c0);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!RequiredIntHelper(i, &v, &state)) failed on line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1c7);
        std::operator<<(poVar2,"\n");
        v.limit_._7_1_ = false;
      }
      else {
        Json::Value::Value(&local_f0,2);
        Json::Value::operator=((Value *)((long)&str.field_2 + 8),&local_f0);
        Json::Value::~Value(&local_f0);
        std::__cxx11::string::operator=((string *)local_58,"default");
        state.doc.field_2._8_4_ = 1;
        bVar1 = std::
                function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                              *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_58,(Value *)((long)&str.field_2 + 8),(cmJSONState *)local_c0);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(!RequiredStringHelper(str, &v, &state)) failed on line "
                                  );
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1cc);
          std::operator<<(poVar2,"\n");
          v.limit_._7_1_ = false;
        }
        else {
          bVar1 = std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                            ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                             (anonymous_namespace)::RequiredIntHelper,
                             (int *)(state.doc.field_2._M_local_buf + 8),
                             (Value *)((long)&str.field_2 + 8),(cmJSONState *)local_c0);
          if (bVar1) {
            if (state.doc.field_2._8_4_ == 2) {
              std::__cxx11::string::operator=((string *)local_58,"default");
              state.doc.field_2._8_4_ = 1;
              bVar1 = std::
                      function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                      ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                                    *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_58,(Value *)0x0,(cmJSONState *)local_c0);
              if (bVar1) {
                poVar2 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(!RequiredStringHelper(str, nullptr, &state)) failed on line "
                                        );
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1d2);
                std::operator<<(poVar2,"\n");
                v.limit_._7_1_ = false;
              }
              else {
                bVar1 = std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                                  ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                                   (anonymous_namespace)::RequiredIntHelper,
                                   (int *)(state.doc.field_2._M_local_buf + 8),(Value *)0x0,
                                   (cmJSONState *)local_c0);
                if (bVar1) {
                  poVar2 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(!RequiredIntHelper(i, nullptr, &state)) failed on line "
                                          );
                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1d3);
                  std::operator<<(poVar2,"\n");
                  v.limit_._7_1_ = false;
                }
                else {
                  v.limit_._7_1_ = true;
                }
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ce);
              std::operator<<(poVar2,"\n");
              v.limit_._7_1_ = false;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(RequiredIntHelper(i, &v, &state)) failed on line "
                                    );
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1cd);
            std::operator<<(poVar2,"\n");
            v.limit_._7_1_ = false;
          }
        }
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(str == \"Hello\") failed on line "
                              );
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1c6);
      std::operator<<(poVar2,"\n");
      v.limit_._7_1_ = false;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(RequiredStringHelper(str, &v, &state)) failed on line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1c5);
    std::operator<<(poVar2,"\n");
    v.limit_._7_1_ = false;
  }
  local_c4 = 1;
  cmJSONState::~cmJSONState((cmJSONState *)local_c0);
  std::__cxx11::string::~string((string *)local_58);
  Json::Value::~Value((Value *)((long)&str.field_2 + 8));
  return v.limit_._7_1_;
}

Assistant:

bool testRequired()
{
  Json::Value v = "Hello";
  std::string str = "default";
  int i = 1;
  cmJSONState state;
  ASSERT_TRUE(RequiredStringHelper(str, &v, &state));
  ASSERT_TRUE(str == "Hello");
  ASSERT_TRUE(!RequiredIntHelper(i, &v, &state));

  v = 2;
  str = "default";
  i = 1;
  ASSERT_TRUE(!RequiredStringHelper(str, &v, &state));
  ASSERT_TRUE(RequiredIntHelper(i, &v, &state));
  ASSERT_TRUE(i == 2);

  str = "default";
  i = 1;
  ASSERT_TRUE(!RequiredStringHelper(str, nullptr, &state));
  ASSERT_TRUE(!RequiredIntHelper(i, nullptr, &state));

  return true;
}